

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  char *pcVar1;
  short *psVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ushort uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  byte *pbVar25;
  ulong uVar26;
  uint uVar27;
  bool bVar28;
  U16 valPerRank [13];
  rankPos rank [32];
  ushort auStack_158 [16];
  undefined8 local_138;
  undefined2 uStack_130;
  undefined6 uStack_12e;
  undefined2 local_128;
  undefined6 uStack_126;
  undefined2 uStack_120;
  undefined6 uStack_11e;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  
  sVar9 = 0xffffffffffffffff;
  if ((((ulong)workSpace & 3) == 0) && (sVar9 = 0xffffffffffffffbe, 0xfff < wkspSize)) {
    uVar7 = 0xb;
    if (maxNbBits != 0) {
      uVar7 = maxNbBits;
    }
    sVar9 = 0xffffffffffffffd2;
    if (maxSymbolValue < 0x100) {
      uVar15 = 0;
      memset(workSpace,0,0x1000);
      memset(&local_138,0,0x100);
      uVar13 = (ulong)(maxSymbolValue + 1);
      do {
        uVar27 = 0x1f;
        if (count[uVar15] + 1 != 0) {
          for (; count[uVar15] + 1 >> uVar27 == 0; uVar27 = uVar27 - 1) {
          }
        }
        *(int *)(&local_138 + uVar27) = *(int *)(&local_138 + uVar27) + 1;
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
      lVar8 = 0x1d;
      do {
        *(int *)(&local_138 + lVar8) =
             *(int *)(&local_138 + lVar8) + *(int *)(&uStack_130 + lVar8 * 4);
        bVar28 = lVar8 != 0;
        lVar8 = lVar8 + -1;
      } while (bVar28);
      lVar8 = 0;
      do {
        *(undefined4 *)((long)&local_138 + (lVar8 * 2 + 1) * 4) =
             *(undefined4 *)(&local_138 + lVar8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x20);
      uVar15 = 0;
      do {
        uVar27 = count[uVar15];
        uVar20 = 0x1f;
        if (uVar27 + 1 != 0) {
          for (; uVar27 + 1 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        uVar21 = (ulong)((uVar20 ^ 0x1fffffe0) * 8 + 0x108);
        uVar20 = *(uint *)((long)&local_138 + uVar21);
        uVar17 = *(uint *)((long)&local_138 + uVar21 + 4);
        uVar26 = (ulong)uVar17;
        *(uint *)((long)&local_138 + uVar21 + 4) = uVar17 + 1;
        uVar21 = uVar26;
        if (uVar20 < uVar17) {
          do {
            uVar21 = uVar21 - 1;
            if (uVar27 <= *(uint *)((long)workSpace + (uVar21 & 0xffffffff) * 8 + 8))
            goto LAB_0045d9be;
            *(undefined8 *)((long)workSpace + uVar21 * 8 + 0x10) =
                 *(undefined8 *)((long)workSpace + (uVar21 & 0xffffffff) * 8 + 8);
            uVar17 = (int)uVar26 - 1;
            uVar26 = (ulong)uVar17;
          } while (uVar20 < uVar17);
          uVar26 = (ulong)uVar20;
        }
LAB_0045d9be:
        *(uint *)((long)workSpace + uVar26 * 8 + 8) = uVar27;
        *(char *)((long)workSpace + uVar26 * 8 + 0xe) = (char)uVar15;
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar13);
      uVar27 = maxSymbolValue - 1;
      do {
        uVar20 = uVar27;
        uVar15 = (ulong)(uVar20 + 1);
        uVar27 = uVar20 - 1;
      } while (*(int *)((long)workSpace + uVar15 * 8 + 8) == 0);
      uVar17 = uVar20 + 1;
      lVar8 = (long)(int)uVar17;
      *(int *)((long)workSpace + 0x808) =
           *(int *)((long)workSpace + lVar8 * 8) + *(int *)((long)workSpace + lVar8 * 8 + 8);
      *(undefined2 *)((long)workSpace + lVar8 * 8 + 4) = 0x100;
      *(undefined2 *)((long)workSpace + lVar8 * 8 + 0xc) = 0x100;
      uVar11 = uVar20 + 0x100;
      if (uVar27 < 0xfffffeff) {
        uVar21 = 0x100;
        do {
          *(undefined4 *)((long)workSpace + uVar21 * 8 + 0x10) = 0x40000000;
          uVar21 = uVar21 + 1;
        } while (uVar21 < uVar11);
      }
      *(undefined4 *)workSpace = 0x80000000;
      if (0x100 < uVar11) {
        uVar24 = 0x100;
        uVar16 = 0x101;
        uVar18 = uVar27;
        do {
          uVar4 = *(uint *)((long)workSpace + (long)(int)uVar18 * 8 + 8);
          uVar5 = *(uint *)((long)workSpace + (long)(int)uVar24 * 8 + 8);
          uVar14 = (uVar24 + 1) - (uint)(uVar4 < uVar5);
          uVar6 = uVar24;
          if (uVar4 < uVar5) {
            uVar6 = uVar18;
          }
          uVar24 = (uint)(uVar4 < uVar5);
          uVar23 = uVar18 - uVar24;
          uVar4 = *(uint *)((long)workSpace + (long)(int)uVar23 * 8 + 8);
          uVar5 = *(uint *)((long)workSpace + (long)(int)uVar14 * 8 + 8);
          uVar18 = (uVar18 - uVar24) - (uint)(uVar4 < uVar5);
          uVar24 = (uVar14 + 1) - (uint)(uVar4 < uVar5);
          if (uVar5 <= uVar4) {
            uVar23 = uVar14;
          }
          *(int *)((long)workSpace + (ulong)uVar16 * 8 + 8) =
               *(int *)((long)workSpace + (ulong)uVar23 * 8 + 8) +
               *(int *)((long)workSpace + (ulong)uVar6 * 8 + 8);
          *(ushort *)((long)workSpace + (ulong)uVar23 * 8 + 0xc) = uVar16;
          *(ushort *)((long)workSpace + (ulong)uVar6 * 8 + 0xc) = uVar16;
          uVar16 = uVar16 + 1;
        } while (uVar16 <= uVar11);
      }
      *(undefined1 *)((long)workSpace + (ulong)uVar11 * 8 + 0xf) = 0;
      if (uVar27 < 0xffffff00) {
        uVar21 = (ulong)(uVar20 + 0xff);
        do {
          uVar21 = uVar21 - 1;
          *(char *)((long)workSpace + uVar21 * 8 + 0x17) =
               *(char *)((long)workSpace +
                        (ulong)*(ushort *)((long)workSpace + uVar21 * 8 + 0x14) * 8 + 0xf) + '\x01';
        } while ((uVar21 & 0xffffff00) != 0);
      }
      uVar21 = 0xffffffffffffffff;
      do {
        *(char *)((long)workSpace + uVar21 * 8 + 0x17) =
             *(char *)((long)workSpace +
                      (ulong)*(ushort *)((long)workSpace + uVar21 * 8 + 0x14) * 8 + 0xf) + '\x01';
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar17);
      bVar3 = *(byte *)((long)workSpace + uVar15 * 8 + 0xf);
      uVar11 = (uint)bVar3;
      uVar27 = (uint)bVar3;
      if (uVar7 <= uVar11 && uVar11 - uVar7 != 0) {
        bVar10 = (byte)(uVar11 - uVar7);
        pbVar25 = (byte *)((long)workSpace + uVar15 * 8 + 0xf);
        iVar19 = 0;
        uVar27 = uVar11;
        do {
          uVar18 = uVar20;
          iVar19 = (-1 << (bVar3 - (char)uVar27 & 0x1f)) + iVar19 + (1 << (bVar10 & 0x1f));
          *pbVar25 = (byte)uVar7;
          pbVar25 = (byte *)((long)workSpace + (ulong)uVar18 * 8 + 0xf);
          uVar27 = (uint)*pbVar25;
          uVar20 = uVar18 - 1;
        } while (uVar7 < *pbVar25);
        uVar15 = (ulong)(uVar18 + 1);
        do {
          uVar27 = (int)uVar15 - 1;
          uVar15 = (ulong)uVar27;
        } while (uVar7 == *(byte *)((long)workSpace + uVar15 * 8 + 0xf));
        uVar20 = iVar19 >> (bVar10 & 0x1f);
        local_108 = 0xf0f0f0f0f0f0f0f0;
        local_118 = 0xf0f0f0f0f0f0f0f0;
        uStack_110 = 0xf0f0f0f0f0f0f0f0;
        local_128 = 0xf0f0;
        uStack_126 = 0xf0f0f0f0f0f0;
        uStack_120 = 0xf0f0;
        uStack_11e = 0xf0f0f0f0f0f0;
        local_138 = 0xf0f0f0f0f0f0f0f0;
        uStack_130 = 0xf0f0;
        uStack_12e = 0xf0f0f0f0f0f0;
        if (-1 < (int)uVar27) {
          pbVar25 = (byte *)((long)workSpace + uVar15 * 8 + 0xf);
          uVar18 = uVar7;
          do {
            if (*pbVar25 < uVar18) {
              uVar18 = (uint)*pbVar25;
              *(uint *)((long)&local_138 + (ulong)(uVar7 - uVar18) * 4) = uVar27;
            }
            pbVar25 = pbVar25 + -8;
            bVar28 = 0 < (int)uVar27;
            uVar27 = uVar27 - 1;
          } while (bVar28);
        }
        for (; 0 < (int)uVar20; uVar20 = (-1 << ((byte)uVar27 & 0x1f)) + uVar20) {
          uVar27 = 0x1f;
          if (uVar20 != 0) {
            for (; uVar20 >> uVar27 == 0; uVar27 = uVar27 - 1) {
            }
          }
          uVar26 = (ulong)(0x20 - (uVar27 ^ 0x1f));
          uVar21 = uVar26;
          if ((uVar27 ^ 0x1f) != 0x1f) {
            do {
              uVar12 = uVar21 - 1;
              uVar21 = (ulong)*(uint *)((long)&local_138 + uVar21 * 4);
              if ((uVar21 != 0xf0f0f0f0) &&
                 ((uVar27 = *(uint *)((long)&local_138 + (uVar12 & 0xffffffff) * 4),
                  uVar27 == 0xf0f0f0f0 ||
                  (*(uint *)((long)workSpace + uVar21 * 8 + 8) <=
                   (uint)(*(int *)((long)workSpace + (ulong)uVar27 * 8 + 8) * 2)))))
              goto LAB_0045dc80;
              uVar26 = (ulong)((int)uVar26 - 1);
              uVar21 = uVar12;
            } while ((uVar12 & 0xfffffffe) != 0);
            uVar26 = 1;
          }
LAB_0045dc80:
          if ((uint)uVar26 < 0xd) {
            do {
              if (*(int *)((long)&local_138 + uVar26 * 4) != -0xf0f0f10) goto LAB_0045dca3;
              uVar26 = uVar26 + 1;
            } while (uVar26 != 0xd);
            uVar26 = 0xd;
          }
LAB_0045dca3:
          uVar27 = (int)uVar26 - 1;
          uVar21 = uVar26 & 0xffffffff;
          if (*(int *)((long)&local_138 + (ulong)uVar27 * 4) == -0xf0f0f10) {
            *(undefined4 *)((long)&local_138 + (ulong)uVar27 * 4) =
                 *(undefined4 *)((long)&local_138 + uVar21 * 4);
          }
          uVar18 = *(uint *)((long)&local_138 + uVar21 * 4);
          pcVar1 = (char *)((long)workSpace + (ulong)uVar18 * 8 + 0xf);
          *pcVar1 = *pcVar1 + '\x01';
          if ((ulong)uVar18 == 0) {
            uVar18 = 0xf0f0f0f0;
          }
          else {
            uVar18 = uVar18 - 1;
            *(uint *)((long)&local_138 + uVar21 * 4) = uVar18;
            if (uVar7 - (int)uVar26 != (uint)*(byte *)((long)workSpace + (ulong)uVar18 * 8 + 0xf)) {
              uVar18 = 0xf0f0f0f0;
            }
          }
          *(uint *)((long)&local_138 + uVar21 * 4) = uVar18;
        }
        uVar27 = uVar7;
        if ((int)uVar20 < 0) {
          uVar21 = (ulong)local_138._4_4_;
          do {
            uVar18 = 0xffffffff;
            if (-1 < (int)uVar20) {
              uVar18 = uVar20;
            }
            iVar19 = 0;
            while ((int)uVar21 + iVar19 != -0xf0f0f10) {
              pcVar1 = (char *)((long)workSpace + (ulong)(iVar19 + (int)uVar21 + 1) * 8 + 0xf);
              *pcVar1 = *pcVar1 + -1;
              iVar19 = iVar19 + 1;
              if (~uVar18 + uVar20 + iVar19 == 0) goto LAB_0045dd95;
            }
            iVar22 = uVar20 + iVar19;
            uVar21 = uVar15;
            do {
              uVar15 = uVar21;
              uVar21 = (ulong)((int)uVar15 - 1);
            } while (uVar7 == *(byte *)((long)workSpace + uVar15 * 8 + 0xf));
            uVar21 = (ulong)((int)uVar15 + 1);
            pcVar1 = (char *)((long)workSpace + uVar21 * 8 + 0xf);
            *pcVar1 = *pcVar1 + -1;
            uVar20 = uVar20 + iVar19 + 1;
          } while (iVar22 < -1);
        }
      }
LAB_0045dd95:
      local_128 = 0;
      uStack_126 = 0;
      uStack_120 = 0;
      local_138 = 0;
      uStack_130 = 0;
      uStack_12e = 0;
      auStack_158[8] = 0;
      auStack_158[9] = 0;
      auStack_158[10] = 0;
      auStack_158[0xb] = 0;
      auStack_158[0xc] = 0;
      auStack_158[0] = 0;
      auStack_158[1] = 0;
      auStack_158[2] = 0;
      auStack_158[3] = 0;
      auStack_158[4] = 0;
      auStack_158[5] = 0;
      auStack_158[6] = 0;
      auStack_158[7] = 0;
      if (uVar27 < 0xd) {
        uVar15 = 0xffffffffffffffff;
        do {
          psVar2 = (short *)((long)&local_138 +
                            (ulong)*(byte *)((long)workSpace + uVar15 * 8 + 0x17) * 2);
          *psVar2 = *psVar2 + 1;
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar17);
        if (uVar27 != 0) {
          if (uVar7 < uVar11) {
            uVar11 = uVar7;
          }
          uVar15 = (ulong)(uVar11 * 2);
          uVar16 = 0;
          do {
            *(ushort *)((long)auStack_158 + uVar15) = uVar16;
            uVar16 = (ushort)(uVar16 + *(short *)((long)&local_138 + uVar15)) >> 1;
            uVar15 = uVar15 - 2;
          } while ((int)uVar15 != 0);
        }
        uVar15 = 0;
        do {
          tree[*(byte *)((long)workSpace + uVar15 * 8 + 0xe)].nbBits =
               *(BYTE *)((long)workSpace + uVar15 * 8 + 0xf);
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
        uVar15 = 0;
        do {
          uVar16 = auStack_158[tree[uVar15].nbBits];
          auStack_158[tree[uVar15].nbBits] = uVar16 + 1;
          tree[uVar15].val = uVar16;
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      sVar9 = 0xffffffffffffffff;
      if (uVar27 < 0xd) {
        sVar9 = (ulong)uVar27;
      }
    }
  }
  return sVar9;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    nodeElt* const huffNode0 = (nodeElt*)workSpace;
    nodeElt* const huffNode = huffNode0+1;
    U32 n, nonNullRank;
    int lowS, lowN;
    U16 nodeNb = STARTNODE;
    U32 nodeRoot;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(huffNodeTable)) return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue);

    /* init for parents */
    nonNullRank = maxSymbolValue;
    while(huffNode[nonNullRank].count == 0) nonNullRank--;
    lowS = nonNullRank; nodeRoot = nodeNb + lowS - 1; lowN = nodeNb;
    huffNode[nodeNb].count = huffNode[lowS].count + huffNode[lowS-1].count;
    huffNode[lowS].parent = huffNode[lowS-1].parent = nodeNb;
    nodeNb++; lowS-=2;
    for (n=nodeNb; n<=nodeRoot; n++) huffNode[n].count = (U32)(1U<<30);
    huffNode0[0].count = (U32)(1U<<31);  /* fake entry, strong barrier */

    /* create parents */
    while (nodeNb <= nodeRoot) {
        U32 n1 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        U32 n2 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        huffNode[nodeNb].count = huffNode[n1].count + huffNode[n2].count;
        huffNode[n1].parent = huffNode[n2].parent = nodeNb;
        nodeNb++;
    }

    /* distribute weights (unlimited tree height) */
    huffNode[nodeRoot].nbBits = 0;
    for (n=nodeRoot-1; n>=STARTNODE; n--)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;
    for (n=0; n<=nonNullRank; n++)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, nonNullRank, maxNbBits);

    /* fill result into tree (val, nbBits) */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+1] = {0};
        U16 valPerRank[HUF_TABLELOG_MAX+1] = {0};
        if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */
        for (n=0; n<=nonNullRank; n++)
            nbPerRank[huffNode[n].nbBits]++;
        /* determine stating value per rank */
        {   U16 min = 0;
            for (n=maxNbBits; n>0; n--) {
                valPerRank[n] = min;      /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        for (n=0; n<=maxSymbolValue; n++)
            tree[huffNode[n].byte].nbBits = huffNode[n].nbBits;   /* push nbBits per symbol, symbol order */
        for (n=0; n<=maxSymbolValue; n++)
            tree[n].val = valPerRank[tree[n].nbBits]++;   /* assign value within rank, symbol order */
    }

    return maxNbBits;
}